

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O1

string * __thiscall
soul::CompileMessage::getAnnotatedSourceLine_abi_cxx11_
          (string *__return_storage_ptr__,CompileMessage *this)

{
  long lVar1;
  LineAndColumn LVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  ulong uVar6;
  uint uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string indent;
  string sourceLine;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  string local_50;
  
  if ((this->location).location.data != (char *)0x0) {
    LVar2 = CodeLocation::getLineAndColumn(&this->location);
    if ((ulong)LVar2 >> 0x20 != 0) {
      CodeLocation::getSourceLine_abi_cxx11_(&local_50,&this->location);
      local_68 = 0;
      local_60 = 0;
      uVar7 = LVar2.column - 1;
      local_70 = &local_60;
      if (uVar7 != 0) {
        uVar6 = 0;
        do {
          std::__cxx11::string::push_back((char)&local_70);
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b0,local_50._M_dataplus._M_p,
                 local_50._M_dataplus._M_p + local_50._M_string_length);
      std::__cxx11::string::append((char *)local_b0);
      plVar3 = (long *)std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_70);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_80 = *plVar4;
        lStack_78 = plVar3[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar4;
        local_90 = (long *)*plVar3;
      }
      local_88 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar5 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar5) {
        lVar1 = plVar3[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      }
      __return_storage_ptr__->_M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((ulong)LVar2 >> 0x20 != 0) {
        return __return_storage_ptr__;
      }
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string CompileMessage::getAnnotatedSourceLine() const
{
    if (location.location.getAddress() != nullptr)
    {
        auto lc = location.getLineAndColumn();

        if (lc.column != 0)
        {
            auto sourceLine = location.getSourceLine();
            std::string indent;

            // because some fools insist on using tab characters, we need to make sure we mirror
            // any tabs in the original source line when indenting the '^' character, so that when
            // it's printed underneath it lines-up regardless of tab size
            for (size_t i = 0; i < lc.column - 1; ++i)
                indent += sourceLine[i] == '\t' ? '\t' : ' ';

            return sourceLine + "\n" + indent + "^";
        }
    }

    return {};
}